

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::MergeFrom
          (TreeEnsembleRegressor *this,TreeEnsembleRegressor *from)

{
  void *pvVar1;
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  TreeEnsembleParameters *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x7e2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->treeensemble_;
  if (from_00 != (TreeEnsembleParameters *)0x0 &&
      from != (TreeEnsembleRegressor *)&_TreeEnsembleRegressor_default_instance_) {
    this_00 = this->treeensemble_;
    if (this_00 == (TreeEnsembleParameters *)0x0) {
      this_00 = (TreeEnsembleParameters *)operator_new(0x50);
      TreeEnsembleParameters::TreeEnsembleParameters(this_00);
      this->treeensemble_ = this_00;
      from_00 = from->treeensemble_;
    }
    if (from_00 == (TreeEnsembleParameters *)0x0) {
      from_00 = (TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this_00,from_00);
  }
  if (from->postevaluationtransform_ != 0) {
    this->postevaluationtransform_ = from->postevaluationtransform_;
  }
  return;
}

Assistant:

void TreeEnsembleRegressor::MergeFrom(const TreeEnsembleRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_treeensemble()) {
    mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from.treeensemble());
  }
  if (from.postevaluationtransform() != 0) {
    set_postevaluationtransform(from.postevaluationtransform());
  }
}